

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

void __thiscall
de::Random::
choose<std::_Rb_tree_const_iterator<unsigned_int>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          (Random *this,_Rb_tree_const_iterator<unsigned_int> first,
          _Rb_tree_const_iterator<unsigned_int> last,
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          result,int numItems)

{
  int iVar1;
  int ndx;
  int max;
  
  max = 0;
  do {
    if (first._M_node == last._M_node) {
      return;
    }
    iVar1 = max;
    if (max < numItems) {
LAB_00432215:
      result._M_current[iVar1] = first._M_node[1]._M_color;
    }
    else {
      iVar1 = getInt(this,0,max);
      if (iVar1 < numItems) goto LAB_00432215;
    }
    first._M_node = (_Base_ptr)std::_Rb_tree_increment(first._M_node);
    max = max + 1;
  } while( true );
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}